

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O1

void __thiscall Process::handleInput(Process *this,int fd)

{
  String *this_00;
  undefined8 this_01;
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  _Any_data local_68;
  code *local_58;
  code *pcStack_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  
  EventLoop::eventLoop();
  if ((EventLoop *)local_68._M_unused._0_8_ == (EventLoop *)0x0) {
    __assert_fail("EventLoop::eventLoop()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/Process.cpp"
                  ,0x2ec,"void Process::handleInput(int)");
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
  }
  EventLoop::eventLoop();
  EventLoop::unregisterSocket((EventLoop *)local_68._M_unused._0_8_,fd);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
  }
  local_48 = &this->mStdInBuffer;
  do {
    this_00 = (this->mStdInBuffer).super__Deque_base<String,_std::allocator<String>_>._M_impl.
              super__Deque_impl_data._M_start._M_cur;
    if ((this->mStdInBuffer).super__Deque_base<String,_std::allocator<String>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur == this_00) {
      return;
    }
    iVar5 = (int)(this_00->mString)._M_string_length;
    if (this->mStdInIndex == 0) {
      do {
        sVar2 = ::write(fd,(this_00->mString)._M_dataplus._M_p,(long)iVar5);
        iVar4 = (int)sVar2;
        if (iVar4 != -1) goto LAB_00171ff7;
        piVar3 = __errno_location();
      } while (*piVar3 == 4);
    }
    else {
      iVar5 = iVar5 - this->mStdInIndex;
      do {
        String::mid((String *)&local_68,this_00,(long)this->mStdInIndex,0xffffffffffffffff);
        sVar2 = ::write(fd,local_68._M_unused._M_object,(long)iVar5);
        iVar4 = (int)sVar2;
        if ((EventLoop *)local_68._M_unused._0_8_ != (EventLoop *)&stack0xffffffffffffffa8) {
          operator_delete(local_68._M_unused._M_object);
        }
        if (iVar4 != -1) goto LAB_00171ff7;
        piVar3 = __errno_location();
      } while (*piVar3 == 4);
    }
    iVar4 = -1;
LAB_00171ff7:
    if (iVar4 == -1) {
      EventLoop::eventLoop();
      this_01 = local_40;
      local_58 = (code *)0x0;
      pcStack_50 = (code *)0x0;
      local_68._M_unused._M_object = (void *)0x0;
      local_68._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_68._M_unused._M_object = operator_new(0x18);
      (((EventLoop *)local_68._M_unused._0_8_)->super_enable_shared_from_this<EventLoop>).
      _M_weak_this.super___weak_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)processCallback;
      (((EventLoop *)local_68._M_unused._0_8_)->super_enable_shared_from_this<EventLoop>).
      _M_weak_this.super___weak_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (((EventLoop *)local_68._M_unused._0_8_)->mMutex).super___mutex_base._M_mutex.__align =
           (long)this;
      pcStack_50 = std::
                   _Function_handler<void_(int,_unsigned_int),_std::_Bind<void_(Process::*(Process_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(int,_int)>_>
                   ::_M_invoke;
      local_58 = std::
                 _Function_handler<void_(int,_unsigned_int),_std::_Bind<void_(Process::*(Process_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(int,_int)>_>
                 ::_M_manager;
      EventLoop::registerSocket
                ((EventLoop *)this_01,fd,2,(function<void_(int,_unsigned_int)> *)&local_68);
      if ((element_type *)local_58 != (element_type *)0x0) {
        (*local_58)(&local_68,&local_68,3);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38);
      }
    }
    else {
      if (iVar4 == iVar5) {
        std::deque<String,_std::allocator<String>_>::pop_front
                  ((deque<String,_std::allocator<String>_> *)local_48);
        iVar5 = 0;
        if (((this->mStdInBuffer).super__Deque_base<String,_std::allocator<String>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur ==
             (this->mStdInBuffer).super__Deque_base<String,_std::allocator<String>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur) && (iVar5 = 0, this->mWantStdInClosed == true))
        {
          EventLoop::eventLoop();
          EventLoop::unregisterSocket((EventLoop *)local_68._M_unused._0_8_,this->mStdIn[1]);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
          }
          do {
            iVar1 = close(this->mStdIn[1]);
            if (iVar1 != -1) break;
            piVar3 = __errno_location();
          } while (*piVar3 == 4);
          this->mStdIn[1] = -1;
          this->mWantStdInClosed = false;
        }
      }
      else {
        iVar5 = this->mStdInIndex + iVar4;
      }
      this->mStdInIndex = iVar5;
    }
    if (iVar4 == -1) {
      return;
    }
  } while( true );
}

Assistant:

void Process::handleInput(int fd)
{
    assert(EventLoop::eventLoop());
    EventLoop::eventLoop()->unregisterSocket(fd);

    //static int ting = 0;
    //printf("Process::handleInput (cnt=%d)\n", ++ting);
    for (;;) {
        if (mStdInBuffer.empty())
            return;

        //printf("Process::handleInput in loop\n");
        int w, want;
        const String &front = mStdInBuffer.front();
        if (mStdInIndex) {
            want = front.size() - mStdInIndex;
            eintrwrap(w, ::write(fd, front.mid(mStdInIndex).constData(), want));
        } else {
            want = front.size();
            eintrwrap(w, ::write(fd, front.constData(), want));
        }
        if (w == -1) {
            EventLoop::eventLoop()->registerSocket(fd, EventLoop::SocketWrite, std::bind(&Process::processCallback, this, std::placeholders::_1, std::placeholders::_2));
            break;
        } else if (w == want) {
            mStdInBuffer.pop_front();
            if (mStdInBuffer.empty() && mWantStdInClosed) {
                EventLoop::eventLoop()->unregisterSocket(mStdIn[1]);
                int err;
                eintrwrap(err, ::close(mStdIn[1]));
                mStdIn[1] = -1;
                mWantStdInClosed = false;
            }
            mStdInIndex = 0;
        } else
            mStdInIndex += w;
    }
}